

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoa.hpp
# Opt level: O3

double __thiscall
ear::hoa::sph_harm<double(*)(int,int)>(hoa *this,int n,int m,double az,double el,norm_f_t *norm)

{
  int m_00;
  undefined4 in_register_00000014;
  uint uVar1;
  policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_R8;
  longdouble in_ST0;
  longdouble in_ST1;
  double dVar2;
  undefined1 local_61;
  longdouble local_60;
  double local_50;
  double local_48;
  uint local_3c;
  double local_38;
  double local_28;
  
  m_00 = (int)norm;
  local_50 = el;
  if (n < 1) {
    if (n < 0) {
      local_48 = sin((double)n * az);
      local_48 = local_48 * -1.4142135623730951;
    }
    else {
      local_48 = 1.0;
    }
  }
  else {
    local_48 = cos((double)n * az);
    local_48 = local_48 * 1.4142135623730951;
  }
  uVar1 = -n;
  if (0 < n) {
    uVar1 = n;
  }
  local_38 = (double)(*(code *)CONCAT44(in_register_00000014,m))((ulong)this & 0xffffffff,uVar1);
  dVar2 = sin(local_50);
  local_60 = (longdouble)CONCAT28(local_60._8_2_,dVar2);
  local_50 = pow(-1.0,(double)(int)uVar1);
  local_28 = local_60._0_8_;
  local_60 = (longdouble)local_60._0_8_;
  local_3c = uVar1;
  powl();
  boost::math::detail::
  legendre_p_imp<long_double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
            ((longdouble *)((ulong)this & 0xffffffff),(detail *)(ulong)uVar1,(int)&local_61,m_00,
             local_60,in_ST0,in_R8);
  local_60 = in_ST1;
  if ((longdouble)1.79769313486232e+308 < ABS(in_ST1)) {
    boost::math::policies::detail::raise_error<std::overflow_error,double>
              ("boost::math::legendre_p<%1%>(int, int, %1%)","numeric overflow");
  }
  return local_48 * local_38 * local_50 * (double)local_60;
}

Assistant:

double sph_harm(int n, int m, double az, double el, NormT norm) {
      double scale;
      if (m > 0)
        scale = std::sqrt(2.0) * std::cos(m * az);
      else if (m < 0)
        scale = -std::sqrt(2.0) * std::sin(m * az);
      else
        scale = 1;

      return norm(n, std::abs(m)) * Alegendre(n, std::abs(m), std::sin(el)) *
             scale;
    }